

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoCube>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *this)

{
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
       &PTR__TPZSavable_016b5610;
  TPZGeoElRefLess<pzgeom::TPZGeoCube>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>,&PTR_PTR_016b2408);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_016b2108;
  TPZVec<long>::TPZVec(&this->fSubEl,0);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(&this->fRefPattern,(TPZRefPattern *)0x0);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}